

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_output_auth
                   (Curl_easy *data,connectdata *conn,char *request,Curl_HttpReq httpreq,char *path,
                   _Bool proxytunnel)

{
  auth *authstatus;
  auth *authstatus_00;
  undefined1 *puVar1;
  uint uVar2;
  unsigned_long uVar3;
  char *first;
  CURLcode CVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar2 >> 0xb & 1) == 0 && (~uVar2 & 5) != 0) && ((data->set).str[0x41] == (char *)0x0)) {
    puVar1 = &(data->state).authhost.field_0x18;
    *puVar1 = *puVar1 | 1;
    puVar1 = &(data->state).authproxy.field_0x18;
    *puVar1 = *puVar1 | 1;
    CVar4 = CURLE_OK;
  }
  else {
    authstatus = &(data->state).authhost;
    authstatus_00 = &(data->state).authproxy;
    uVar3 = authstatus->want;
    if ((uVar3 != 0) && ((data->state).authhost.picked == 0)) {
      (data->state).authhost.picked = uVar3;
    }
    uVar3 = authstatus_00->want;
    if ((uVar3 != 0) && ((data->state).authproxy.picked == 0)) {
      (data->state).authproxy.picked = uVar3;
    }
    uVar7 = *(ulong *)&(conn->bits).field_0x4;
    if (((uVar7 & 1) == 0) || (((uVar7 & 8) == 0) == proxytunnel)) {
      puVar1 = &(data->state).authproxy.field_0x18;
      *puVar1 = *puVar1 | 1;
    }
    else {
      CVar4 = output_auth_headers(data,conn,authstatus_00,request,path,true);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    if ((((((data->state).field_0x660 & 2) == 0) || (((conn->bits).field_0x6 & 0x80) != 0)) ||
        (first = (data->state).first_host, first == (char *)0x0)) ||
       ((((data->set).field_0x9a3 & 1) != 0 ||
        (iVar5 = Curl_strcasecompare(first,(conn->host).name), iVar5 != 0)))) {
      CVar4 = output_auth_headers(data,conn,authstatus,request,path,false);
      bVar6 = (data->state).authhost.field_0x18;
    }
    else {
      bVar6 = (data->state).authhost.field_0x18 | 1;
      (data->state).authhost.field_0x18 = bVar6;
      CVar4 = CURLE_OK;
    }
    if ((((bVar6 & 3) == 2) || (((data->state).authproxy.field_0x18 & 3) == 2)) &&
       ((httpreq != HTTPREQ_GET && (httpreq != HTTPREQ_HEAD)))) {
      uVar7 = *(ulong *)&(conn->bits).field_0x4 | 0x20000;
    }
    else {
      uVar7 = *(ulong *)&(conn->bits).field_0x4 & 0xfffffffffffdffff;
    }
    *(ulong *)&(conn->bits).field_0x4 = uVar7;
  }
  return CVar4;
}

Assistant:

CURLcode
Curl_http_output_auth(struct Curl_easy *data,
                      struct connectdata *conn,
                      const char *request,
                      Curl_HttpReq httpreq,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if(
#ifndef CURL_DISABLE_PROXY
    (conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
#endif
     conn->bits.user_passwd || data->set.str[STRING_BEARER])
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
     (conn->bits.tunnel_proxy == (bit)proxytunnel)) {
    result = output_auth_headers(data, conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original
     host due to a location-follow, we do some weirdo checks here */
  if(!data->state.this_is_a_follow ||
     conn->bits.netrc ||
     !data->state.first_host ||
     data->set.allow_auth_to_other_hosts ||
     strcasecompare(data->state.first_host, conn->host.name)) {
    result = output_auth_headers(data, conn, authhost, request, path, FALSE);
  }
  else
    authhost->done = TRUE;

  if(((authhost->multipass && !authhost->done) ||
      (authproxy->multipass && !authproxy->done)) &&
     (httpreq != HTTPREQ_GET) &&
     (httpreq != HTTPREQ_HEAD)) {
    /* Auth is required and we are not authenticated yet. Make a PUT or POST
       with content-length zero as a "probe". */
    conn->bits.authneg = TRUE;
  }
  else
    conn->bits.authneg = FALSE;

  return result;
}